

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O2

void __thiscall QGles2GraphicsPipeline::destroy(QGles2GraphicsPipeline *this)

{
  anon_struct_4_1_4eff857e_for_buffer aVar1;
  QRhiImplementation *this_00;
  long in_FS_OFFSET;
  DeferredReleaseEntry local_24;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  aVar1.buffer = this->program;
  if (aVar1.buffer != 0) {
    local_24.field_1.renderbuffer.renderbuffer2 = 0xaaaaaaaa;
    local_24.type = Pipeline;
    this->program = 0;
    (this->uniforms).super_QVLABase<QGles2UniformDescription>.super_QVLABaseBase.s = 0;
    (this->samplers).super_QVLABase<QGles2SamplerDescription>.super_QVLABaseBase.s = 0;
    this_00 = (this->super_QRhiGraphicsPipeline).super_QRhiResource.m_rhi;
    local_24.field_1.renderbuffer.renderbuffer = aVar1.buffer;
    if (this_00 != (QRhiImplementation *)0x0) {
      QList<QRhiGles2::DeferredReleaseEntry>::emplaceBack<QRhiGles2::DeferredReleaseEntry_const&>
                ((QList<QRhiGles2::DeferredReleaseEntry> *)&this_00[2].implThread,&local_24);
      QRhiImplementation::unregisterResource(this_00,(QRhiResource *)this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGles2GraphicsPipeline::destroy()
{
    if (!program)
        return;

    QRhiGles2::DeferredReleaseEntry e;
    e.type = QRhiGles2::DeferredReleaseEntry::Pipeline;

    e.pipeline.program = program;

    program = 0;
    uniforms.clear();
    samplers.clear();

    QRHI_RES_RHI(QRhiGles2);
    if (rhiD) {
        rhiD->releaseQueue.append(e);
        rhiD->unregisterResource(this);
    }
}